

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O1

void Sbc_SimMult(word *A,word *B,word *R,int nIns)

{
  word wVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (0x40 < (uint)nIns) {
    __assert_fail("nBits >= 0 && nBits <= 64",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                  ,0xc2,"word Abc_Tt6Mask(int)");
  }
  lVar5 = 0;
  do {
    R[lVar5 + 0x40] = 0;
    R[lVar5] = 0;
    B[lVar5] = 0;
    A[lVar5] = 0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x40);
  uVar6 = 0xffffffffffffffff >> (0x40U - (char)nIns & 0x3f);
  Gia_ManRandom(1);
  lVar5 = 0;
  do {
    if (lVar5 == 0) {
      uVar10 = 0;
      uVar2 = 0;
    }
    else {
      wVar1 = Gia_ManRandomW(0);
      uVar10 = wVar1 & uVar6;
      wVar1 = Gia_ManRandomW(0);
      uVar2 = wVar1 & uVar6;
    }
    uVar7 = (uVar10 & 0xffffffff) * (uVar2 >> 0x20);
    uVar3 = (uVar2 & 0xffffffff) * (uVar10 >> 0x20);
    uVar8 = 1L << ((byte)lVar5 & 0x3f);
    uVar4 = 0;
    do {
      uVar9 = 1L << ((byte)uVar4 & 0x3f);
      if ((uVar10 >> (uVar4 & 0x3f) & 1) != 0) {
        A[uVar4] = A[uVar4] | uVar8;
      }
      if ((uVar9 & uVar2) != 0) {
        B[uVar4] = B[uVar4] | uVar8;
      }
      if ((uVar9 & uVar2 * uVar10) != 0) {
        R[uVar4] = R[uVar4] | uVar8;
      }
      if ((uVar9 & (((uVar2 & 0xffffffff) * (uVar10 & 0xffffffff) >> 0x20) +
                    (uVar3 & 0xffffffff) + (uVar7 & 0xffffffff) >> 0x20) +
                   (uVar3 >> 0x20) + (uVar7 >> 0x20) + (uVar10 >> 0x20) * (uVar2 >> 0x20)) != 0) {
        R[uVar4 + 0x40] = R[uVar4 + 0x40] | uVar8;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != 0x40);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x40);
  return;
}

Assistant:

void Sbc_SimMult( word A[64], word B[64], word R[128], int nIns )
{
    word a, b, r[2], Mask = Abc_Tt6Mask(nIns); int i, k;
    for ( i = 0; i < 64; i++ )
        A[i] = B[i] = R[i] = R[i+64] = 0;
    Gia_ManRandom(1);
    for ( i = 0; i < 64; i++ )
    {
        a = i ? (Mask & Gia_ManRandomW(0)) : 0;
        b = i ? (Mask & Gia_ManRandomW(0)) : 0;        
        Sbc_Mult( a, b, r );
        for ( k = 0; k < 64; k++ )
        {
            if ( (a    >> k) & 1 )  A[k]    |= ((word)1 << i);
            if ( (b    >> k) & 1 )  B[k]    |= ((word)1 << i);
            if ( (r[0] >> k) & 1 )  R[k]    |= ((word)1 << i);
            if ( (r[1] >> k) & 1 )  R[k+64] |= ((word)1 << i);
        }
    }
//    for ( i = 0; i < 128; i++ )
//        for ( k = 0; k < 64; k++, printf( "\n" ) )
//            printf( "%d", (R[i] >> k) & 1 );
}